

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.cpp
# Opt level: O2

vector<UniValue,_std::allocator<UniValue>_> *
common::GetSettingsList
          (vector<UniValue,_std::allocator<UniValue>_> *__return_storage_ptr__,Settings *settings,
          string *section,string *name,bool ignore_default_section_config)

{
  mapped_type *pmVar1;
  mapped_type *pmVar2;
  mapped_type *pmVar3;
  long in_FS_OFFSET;
  SettingsSpan span;
  SettingsSpan span_00;
  anon_class_32_4_dac78d21 local_88;
  bool prev_negated_empty;
  bool done;
  bool ignore_default_section_config_local;
  SettingsSpan local_60;
  SettingsSpan local_50;
  SettingsSpan local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_88.ignore_default_section_config = &ignore_default_section_config_local;
  (__return_storage_ptr__->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.done = &done;
  done = false;
  local_88.prev_negated_empty = &prev_negated_empty;
  prev_negated_empty = false;
  local_88.result = __return_storage_ptr__;
  ignore_default_section_config_local = ignore_default_section_config;
  pmVar1 = FindKey<std::map<std::__cxx11::string,UniValue,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,UniValue>>>const&,std::__cxx11::string_const&>
                     (&settings->forced_settings,name);
  if (pmVar1 != (mapped_type *)0x0) {
    span.size = 1;
    span.data = pmVar1;
    GetSettingsList::anon_class_32_4_dac78d21::operator()(&local_88,span,FORCED);
  }
  pmVar2 = FindKey<std::map<std::__cxx11::string,std::vector<UniValue,std::allocator<UniValue>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<UniValue,std::allocator<UniValue>>>>>const&,std::__cxx11::string_const&>
                     (&settings->command_line_options,name);
  if (pmVar2 != (mapped_type *)0x0) {
    SettingsSpan::SettingsSpan(&local_40,pmVar2);
    GetSettingsList::anon_class_32_4_dac78d21::operator()(&local_88,local_40,COMMAND_LINE);
  }
  pmVar1 = FindKey<std::map<std::__cxx11::string,UniValue,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,UniValue>>>const&,std::__cxx11::string_const&>
                     (&settings->rw_settings,name);
  if (pmVar1 != (mapped_type *)0x0) {
    span_00.size = 1;
    span_00.data = pmVar1;
    GetSettingsList::anon_class_32_4_dac78d21::operator()(&local_88,span_00,RW_SETTINGS);
  }
  if (section->_M_string_length != 0) {
    pmVar3 = FindKey<std::map<std::__cxx11::string,std::map<std::__cxx11::string,std::vector<UniValue,std::allocator<UniValue>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<UniValue,std::allocator<UniValue>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::map<std::__cxx11::string,std::vector<UniValue,std::allocator<UniValue>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<UniValue,std::allocator<UniValue>>>>>>>>const&,std::__cxx11::string_const&>
                       (&settings->ro_config,section);
    if (pmVar3 != (mapped_type *)0x0) {
      pmVar2 = FindKey<std::map<std::__cxx11::string,std::vector<UniValue,std::allocator<UniValue>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<UniValue,std::allocator<UniValue>>>>>const&,std::__cxx11::string_const&>
                         (pmVar3,name);
      if (pmVar2 != (mapped_type *)0x0) {
        SettingsSpan::SettingsSpan(&local_50,pmVar2);
        GetSettingsList::anon_class_32_4_dac78d21::operator()
                  (&local_88,local_50,CONFIG_FILE_NETWORK_SECTION);
      }
    }
  }
  pmVar3 = FindKey<std::map<std::__cxx11::string,std::map<std::__cxx11::string,std::vector<UniValue,std::allocator<UniValue>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<UniValue,std::allocator<UniValue>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::map<std::__cxx11::string,std::vector<UniValue,std::allocator<UniValue>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<UniValue,std::allocator<UniValue>>>>>>>>const&,char_const(&)[1]>
                     (&settings->ro_config,(char (*) [1])0x4281e8);
  if (pmVar3 != (mapped_type *)0x0) {
    pmVar2 = FindKey<std::map<std::__cxx11::string,std::vector<UniValue,std::allocator<UniValue>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<UniValue,std::allocator<UniValue>>>>>const&,std::__cxx11::string_const&>
                       (pmVar3,name);
    if (pmVar2 != (mapped_type *)0x0) {
      SettingsSpan::SettingsSpan(&local_60,pmVar2);
      GetSettingsList::anon_class_32_4_dac78d21::operator()
                (&local_88,local_60,CONFIG_FILE_DEFAULT_SECTION);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<SettingsValue> GetSettingsList(const Settings& settings,
    const std::string& section,
    const std::string& name,
    bool ignore_default_section_config)
{
    std::vector<SettingsValue> result;
    bool done = false; // Done merging any more settings sources.
    bool prev_negated_empty = false;
    MergeSettings(settings, section, name, [&](SettingsSpan span, Source source) {
        // Weird behavior preserved for backwards compatibility: Apply config
        // file settings even if negated on command line. Negating a setting on
        // command line will ignore earlier settings on the command line and
        // ignore settings in the config file, unless the negated command line
        // value is followed by non-negated value, in which case config file
        // settings will be brought back from the dead (but earlier command
        // line settings will still be ignored).
        const bool add_zombie_config_values =
            (source == Source::CONFIG_FILE_NETWORK_SECTION || source == Source::CONFIG_FILE_DEFAULT_SECTION) &&
            !prev_negated_empty;

        // Ignore settings in default config section if requested.
        if (ignore_default_section_config && source == Source::CONFIG_FILE_DEFAULT_SECTION) return;

        // Add new settings to the result if isn't already complete, or if the
        // values are zombies.
        if (!done || add_zombie_config_values) {
            for (const auto& value : span) {
                if (value.isArray()) {
                    result.insert(result.end(), value.getValues().begin(), value.getValues().end());
                } else {
                    result.push_back(value);
                }
            }
        }

        // If a setting was negated, or if a setting was forced, set
        // done to true to ignore any later lower priority settings.
        done |= span.negated() > 0 || source == Source::FORCED;

        // Update the negated and empty state used for the zombie values check.
        prev_negated_empty |= span.last_negated() && result.empty();
    });
    return result;
}